

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3WhereEnd(WhereInfo *pWInfo)

{
  WhereLevel *pWVar1;
  Op *pOVar2;
  byte bVar3;
  int iVar4;
  Parse *pParse;
  sqlite3 *db;
  Vdbe *v;
  SrcList *pTabList;
  WhereRightJoin *pWVar5;
  WhereLoop *pWVar6;
  Schema *pSVar7;
  Table *pTVar8;
  Index *pIVar9;
  Index *pIVar10;
  bool bVar11;
  char cVar12;
  ushort uVar13;
  int iVar14;
  anon_union_16_2_b76807be_for_u *paVar15;
  ulong uVar16;
  u8 uVar17;
  Schema **ppSVar18;
  IndexedExpr *pIVar19;
  long lVar20;
  u16 *puVar21;
  ulong uVar22;
  Op *pOVar23;
  Index **ppIVar24;
  uint uVar25;
  int iVar26;
  WhereRightJoin *pRJ;
  u8 *puVar27;
  int op;
  int iVar28;
  uint uVar29;
  WhereLevel *pLevel;
  
  pParse = pWInfo->pParse;
  db = pParse->db;
  v = pParse->pVdbe;
  if ((ulong)pWInfo->nLevel == 0) {
    cVar12 = '\0';
  }
  else {
    pTabList = pWInfo->pTabList;
    iVar4 = v->nOp;
    pLevel = pWInfo->a;
    cVar12 = '\0';
    uVar16 = (ulong)pWInfo->nLevel;
    do {
      pWVar1 = pLevel + (uVar16 - 1);
      pWVar5 = pWInfo->a[uVar16 - 1].pRJ;
      if (pWVar5 != (WhereRightJoin *)0x0) {
        sqlite3VdbeResolveLabel(v,pWVar1->addrCont);
        pWVar1->addrCont = 0;
        pWVar5->endSubrtn = v->nOp;
        sqlite3VdbeAddOp3(v,0x43,pWVar5->regReturn,pWVar5->addrSubrtn,1);
        cVar12 = cVar12 + '\x01';
      }
      pWVar6 = pWVar1->pWLoop;
      if (pWVar1->op == 0xbb) {
        if (pWVar1->addrCont != 0) {
          sqlite3VdbeResolveLabel(v,pWVar1->addrCont);
        }
      }
      else {
        iVar28 = 0;
        iVar14 = 0;
        if ((((pWInfo->eDistinct == '\x02') && (iVar14 = iVar28, uVar16 == pWInfo->nLevel)) &&
            ((pWVar6->wsFlags & 0x200) != 0)) &&
           (pIVar9 = (pWVar6->u).btree.pIndex, (pIVar9->field_0x63 & 0x80) != 0)) {
          uVar13 = (pWVar6->u).btree.nDistinctCol;
          if ((uVar13 != 0) && (uVar29 = (uint)uVar13, 0x23 < pIVar9->aiRowLogEst[uVar13])) {
            iVar14 = pParse->nMem + 1;
            uVar25 = 0;
            do {
              sqlite3VdbeAddOp3(v,0x5e,pWVar1->iIdxCur,uVar25,iVar14 + uVar25);
              uVar25 = uVar25 + 1;
            } while (uVar29 != uVar25);
            pParse->nMem = pParse->nMem + uVar29 + 1;
            iVar14 = sqlite3VdbeAddOp4Int
                               (v,(uint)(pWVar1->op != '&') * 3 + 0x15,pWVar1->iIdxCur,0,iVar14,
                                uVar29);
            sqlite3VdbeAddOp3(v,9,1,pWVar1->p2,0);
          }
        }
        if (pWVar1->addrCont != 0) {
          sqlite3VdbeResolveLabel(v,pWVar1->addrCont);
        }
        sqlite3VdbeAddOp3(v,(uint)pWVar1->op,pWVar1->p1,pWVar1->p2,(uint)pWVar1->p3);
        if (0 < (long)v->nOp) {
          v->aOp[(long)v->nOp + -1].p5 = (ushort)pWVar1->p5;
        }
        if (pWVar1->regBignull != 0) {
          sqlite3VdbeResolveLabel(v,pWVar1->addrBignull);
          sqlite3VdbeAddOp3(v,0x3d,pWVar1->regBignull,pWVar1->p2 + -1,0);
        }
        if (iVar14 != 0) {
          pOVar23 = (Op *)&sqlite3VdbeGetOp_dummy;
          if (v->db->mallocFailed == '\0') {
            pOVar23 = v->aOp + iVar14;
          }
          pOVar23->p2 = v->nOp;
        }
      }
      if (((pWVar6->wsFlags & 0x800) != 0) && (0 < (pWVar1->u).in.nIn)) {
        sqlite3VdbeResolveLabel(v,pWVar1->addrNxt);
        iVar14 = (pWVar1->u).in.nIn;
        if (0 < (long)iVar14) {
          iVar28 = v->nOp;
          uVar17 = v->db->mallocFailed;
          iVar26 = iVar14 + 1;
          puVar27 = &(pWVar1->u).in.aInLoop[(long)iVar14 + -1].eEndLoopOp;
          do {
            pOVar23 = (Op *)&sqlite3VdbeGetOp_dummy;
            if (uVar17 == '\0') {
              pOVar23 = v->aOp + (long)*(int *)(puVar27 + -0xc) + 1;
            }
            pOVar23->p2 = iVar28;
            if (*puVar27 != 0xbb) {
              if (*(int *)(puVar27 + -4) != 0) {
                uVar29 = pWVar6->wsFlags & 0x40400;
                if (pWVar1->iLeftJoin != 0) {
                  sqlite3VdbeAddOp3(v,0x19,((InLoop *)(puVar27 + -0x10))->iCur,
                                    (uint)(uVar29 == 0x40000) + iVar28 + 2,0);
                }
                if (uVar29 == 0x40000) {
                  sqlite3VdbeAddOp4Int
                            (v,0x1a,pWVar1->iIdxCur,v->nOp + 2,*(int *)(puVar27 + -8),
                             *(int *)(puVar27 + -4));
                  pOVar23 = (Op *)&sqlite3VdbeGetOp_dummy;
                  if (v->db->mallocFailed == '\0') {
                    pOVar23 = v->aOp + (long)*(int *)(puVar27 + -0xc) + 1;
                  }
                  pOVar23->p2 = v->nOp;
                }
              }
              sqlite3VdbeAddOp3(v,(uint)*puVar27,((InLoop *)(puVar27 + -0x10))->iCur,
                                *(int *)(puVar27 + -0xc),0);
              iVar28 = v->nOp;
              uVar17 = v->db->mallocFailed;
            }
            pOVar23 = (Op *)&sqlite3VdbeGetOp_dummy;
            if (uVar17 == '\0') {
              pOVar23 = v->aOp + (long)*(int *)(puVar27 + -0xc) + -1;
            }
            pOVar23->p2 = iVar28;
            iVar26 = iVar26 + -1;
            puVar27 = puVar27 + -0x14;
          } while (1 < iVar26);
        }
      }
      sqlite3VdbeResolveLabel(v,pWVar1->addrBrk);
      if (pWVar1->pRJ != (WhereRightJoin *)0x0) {
        sqlite3VdbeAddOp3(v,0x43,pWVar1->pRJ->regReturn,0,1);
      }
      if (pWVar1->addrSkip != 0) {
        sqlite3VdbeAddOp3(v,9,0,pWVar1->addrSkip,0);
        iVar14 = v->nOp;
        if (v->db->mallocFailed == '\0') {
          pOVar23 = v->aOp + (long)pWVar1->addrSkip + -2;
          v->aOp[pWVar1->addrSkip].p2 = iVar14;
        }
        else {
          pOVar23 = (Op *)&sqlite3VdbeGetOp_dummy;
          DAT_00241348 = iVar14;
        }
        pOVar23->p2 = iVar14;
      }
      if (pWVar1->addrLikeRep != 0) {
        sqlite3VdbeAddOp3(v,0x3d,pWVar1->iLikeRepCntr >> 1,pWVar1->addrLikeRep,0);
      }
      if (pWVar1->iLeftJoin != 0) {
        uVar29 = pWVar6->wsFlags;
        iVar14 = sqlite3VdbeAddOp3(v,0x32,pWVar1->iLeftJoin,0,0);
        if ((uVar29 & 0x40) == 0) {
          bVar3 = pWVar1->iFrom;
          if ((pTabList->a[bVar3].fg.field_0x1 & 0x40) != 0) {
            iVar28 = (pTabList->a[bVar3].u4.pSubq)->regResult;
            sqlite3VdbeAddOp3(v,0x4b,0,iVar28,iVar28 + (pTabList->a[bVar3].pSTab)->nCol + -1);
          }
          sqlite3VdbeAddOp3(v,0x88,pWVar1->iTabCur,0,0);
        }
        if ((uVar29 >> 9 & 1) == 0) {
          if (((uVar29 >> 0xd & 1) != 0) && ((pWVar1->u).pCoveringIdx != (Index *)0x0)) {
LAB_0018f30c:
            pIVar9 = (pWVar1->u).pCoveringIdx;
            if (pIVar9->pSchema == (Schema *)0x0) {
              iVar28 = -0x8000;
            }
            else {
              iVar28 = -1;
              ppSVar18 = &db->aDb->pSchema;
              do {
                iVar28 = iVar28 + 1;
                pSVar7 = *ppSVar18;
                ppSVar18 = ppSVar18 + 4;
              } while (pSVar7 != pIVar9->pSchema);
            }
            sqlite3VdbeAddOp3(v,0x65,pWVar1->iIdxCur,pIVar9->tnum,iVar28);
            sqlite3VdbeSetP4KeyInfo(pParse,pIVar9);
            goto LAB_0018f365;
          }
        }
        else {
          if ((uVar29 >> 0xd & 1) != 0) goto LAB_0018f30c;
LAB_0018f365:
          sqlite3VdbeAddOp3(v,0x88,pWVar1->iIdxCur,0,0);
        }
        if (pWVar1->op == 'C') {
          iVar28 = pWVar1->addrFirst;
          iVar26 = pWVar1->p1;
          op = 10;
        }
        else {
          iVar28 = pWVar1->addrFirst;
          op = 9;
          iVar26 = 0;
        }
        sqlite3VdbeAddOp3(v,op,iVar26,iVar28,0);
        pOVar23 = (Op *)&sqlite3VdbeGetOp_dummy;
        if (v->db->mallocFailed == '\0') {
          pOVar23 = v->aOp + iVar14;
        }
        pOVar23->p2 = v->nOp;
      }
      bVar11 = 1 < (long)uVar16;
      uVar16 = uVar16 - 1;
    } while (bVar11);
    if (pWInfo->nLevel != '\0') {
      uVar29 = 0;
      do {
        if (pLevel->pRJ == (WhereRightJoin *)0x0) {
          bVar3 = pLevel->iFrom;
          if ((pTabList->a[bVar3].fg.field_0x1 & 0x40) == 0) {
            pTVar8 = pTabList->a[bVar3].pSTab;
            pWVar6 = pLevel->pWLoop;
            if ((pWVar6->wsFlags & 0x240) == 0) {
              if ((pWVar6->wsFlags >> 0xd & 1) == 0) goto LAB_0018f67d;
              paVar15 = &pLevel->u;
            }
            else {
              paVar15 = (anon_union_16_2_b76807be_for_u *)&(pWVar6->u).btree.pIndex;
            }
            pIVar9 = paVar15->pCoveringIdx;
            if ((pIVar9 != (Index *)0x0) && (db->mallocFailed == '\0')) {
              iVar14 = iVar4;
              if ((pWInfo->eOnePass != '\0') && ((pIVar9->pTable->tabFlags & 0x80) == 0)) {
                iVar14 = pWInfo->iEndWhere;
              }
              if (((pIVar9->field_0x64 & 0x10) != 0) &&
                 (pIVar19 = pParse->pIdxEpr, pIVar19 != (IndexedExpr *)0x0)) {
                iVar28 = pLevel->iIdxCur;
                do {
                  if (pIVar19->iIdxCur == iVar28) {
                    pIVar19->iDataCur = -1;
                    pIVar19->iIdxCur = -1;
                  }
                  pIVar19 = pIVar19->pIENext;
                } while (pIVar19 != (IndexedExpr *)0x0);
              }
              lVar20 = (long)pLevel->addrBody + 1;
              pOVar23 = (Op *)&sqlite3VdbeGetOp_dummy;
              if (v->db->mallocFailed == '\0') {
                pOVar23 = v->aOp + lVar20;
              }
              pOVar2 = pOVar23 + (iVar14 - (int)lVar20);
              do {
                if (pOVar23->p1 == pLevel->iTabCur) {
                  uVar17 = pOVar23->opcode;
                  if (uVar17 == '\x14') {
LAB_0018f5fb:
                    pOVar23->p1 = pLevel->iIdxCur;
                  }
                  else if (uVar17 == 0x87) {
                    pOVar23->p1 = pLevel->iIdxCur;
                    pOVar23->opcode = 0x8e;
                  }
                  else if (uVar17 == '^') {
                    uVar16 = (ulong)pOVar23->p2;
                    ppIVar24 = &pTVar8->pIndex;
                    if ((char)pTVar8->tabFlags < '\0') {
                      do {
                        pIVar10 = *ppIVar24;
                        ppIVar24 = &pIVar10->pNext;
                      } while ((*(ushort *)&pIVar10->field_0x63 & 3) != 2);
                      uVar16 = (ulong)(ushort)pIVar10->aiColumn[uVar16];
                    }
                    else if ((-1 < (short)pOVar23->p2) && ((pTVar8->tabFlags & 0x20) != 0)) {
                      puVar21 = &pTVar8->aCol->colFlags;
                      lVar20 = -1;
                      do {
                        uVar13 = (short)uVar16 + (ushort)((*puVar21 >> 5 & 1) != 0);
                        uVar16 = (ulong)uVar13;
                        lVar20 = lVar20 + 1;
                        puVar21 = puVar21 + 8;
                      } while (lVar20 < (short)uVar13);
                    }
                    if ((ulong)pIVar9->nColumn != 0) {
                      uVar22 = 0;
                      do {
                        if (pIVar9->aiColumn[uVar22] == (short)uVar16) {
                          if (-1 < (short)uVar22) {
                            pOVar23->p2 = (uint)uVar22 & 0x7fff;
                            goto LAB_0018f5fb;
                          }
                          break;
                        }
                        uVar22 = uVar22 + 1;
                      } while (pIVar9->nColumn != uVar22);
                    }
                    uVar25 = pWVar6->wsFlags;
                    if ((uVar25 & 0x4000040) != 0) {
                      if ((uVar25 & 0x40) == 0) {
                        pWVar6->wsFlags = uVar25 & 0xfbffffbf;
                        sqlite3WhereAddExplainText
                                  (pParse,pLevel->addrBody + -1,pTabList,pLevel,pWInfo->wctrlFlags);
                      }
                      else {
                        sqlite3ErrorMsg(pParse,"internal query planner error");
                        pParse->rc = 2;
                      }
                    }
                  }
                }
                pOVar23 = pOVar23 + 1;
              } while (pOVar23 < pOVar2);
            }
          }
          else {
            translateColumnToCopy
                      (pParse,pLevel->addrBody,pLevel->iTabCur,
                       (pTabList->a[bVar3].u4.pSubq)->regResult,0);
          }
        }
        else {
          sqlite3WhereRightJoinLoop(pWInfo,uVar29,pLevel);
        }
LAB_0018f67d:
        uVar29 = uVar29 + 1;
        pLevel = pLevel + 1;
      } while (uVar29 < pWInfo->nLevel);
    }
  }
  sqlite3VdbeResolveLabel(v,pWInfo->iBreak);
  pParse->nQueryLoop = (LogEst)pWInfo->savedNQueryLoop;
  whereInfoFree(db,pWInfo);
  pParse->withinRJSubrtn = pParse->withinRJSubrtn - cVar12;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WhereEnd(WhereInfo *pWInfo){
  Parse *pParse = pWInfo->pParse;
  Vdbe *v = pParse->pVdbe;
  int i;
  WhereLevel *pLevel;
  WhereLoop *pLoop;
  SrcList *pTabList = pWInfo->pTabList;
  sqlite3 *db = pParse->db;
  int iEnd = sqlite3VdbeCurrentAddr(v);
  int nRJ = 0;

  /* Generate loop termination code.
  */
  VdbeModuleComment((v, "End WHERE-core"));
  for(i=pWInfo->nLevel-1; i>=0; i--){
    int addr;
    pLevel = &pWInfo->a[i];
    if( pLevel->pRJ ){
      /* Terminate the subroutine that forms the interior of the loop of
      ** the RIGHT JOIN table */
      WhereRightJoin *pRJ = pLevel->pRJ;
      sqlite3VdbeResolveLabel(v, pLevel->addrCont);
      pLevel->addrCont = 0;
      pRJ->endSubrtn = sqlite3VdbeCurrentAddr(v);
      sqlite3VdbeAddOp3(v, OP_Return, pRJ->regReturn, pRJ->addrSubrtn, 1);
      VdbeCoverage(v);
      nRJ++;
    }
    pLoop = pLevel->pWLoop;
    if( pLevel->op!=OP_Noop ){
#ifndef SQLITE_DISABLE_SKIPAHEAD_DISTINCT
      int addrSeek = 0;
      Index *pIdx;
      int n;
      if( pWInfo->eDistinct==WHERE_DISTINCT_ORDERED
       && i==pWInfo->nLevel-1  /* Ticket [ef9318757b152e3] 2017-10-21 */
       && (pLoop->wsFlags & WHERE_INDEXED)!=0
       && (pIdx = pLoop->u.btree.pIndex)->hasStat1
       && (n = pLoop->u.btree.nDistinctCol)>0
       && pIdx->aiRowLogEst[n]>=36
      ){
        int r1 = pParse->nMem+1;
        int j, op;
        for(j=0; j<n; j++){
          sqlite3VdbeAddOp3(v, OP_Column, pLevel->iIdxCur, j, r1+j);
        }
        pParse->nMem += n+1;
        op = pLevel->op==OP_Prev ? OP_SeekLT : OP_SeekGT;
        addrSeek = sqlite3VdbeAddOp4Int(v, op, pLevel->iIdxCur, 0, r1, n);
        VdbeCoverageIf(v, op==OP_SeekLT);
        VdbeCoverageIf(v, op==OP_SeekGT);
        sqlite3VdbeAddOp2(v, OP_Goto, 1, pLevel->p2);
      }
#endif /* SQLITE_DISABLE_SKIPAHEAD_DISTINCT */
      /* The common case: Advance to the next row */
      if( pLevel->addrCont ) sqlite3VdbeResolveLabel(v, pLevel->addrCont);
      sqlite3VdbeAddOp3(v, pLevel->op, pLevel->p1, pLevel->p2, pLevel->p3);
      sqlite3VdbeChangeP5(v, pLevel->p5);
      VdbeCoverage(v);
      VdbeCoverageIf(v, pLevel->op==OP_Next);
      VdbeCoverageIf(v, pLevel->op==OP_Prev);
      VdbeCoverageIf(v, pLevel->op==OP_VNext);
      if( pLevel->regBignull ){
        sqlite3VdbeResolveLabel(v, pLevel->addrBignull);
        sqlite3VdbeAddOp2(v, OP_DecrJumpZero, pLevel->regBignull, pLevel->p2-1);
        VdbeCoverage(v);
      }
#ifndef SQLITE_DISABLE_SKIPAHEAD_DISTINCT
      if( addrSeek ) sqlite3VdbeJumpHere(v, addrSeek);
#endif
    }else if( pLevel->addrCont ){
      sqlite3VdbeResolveLabel(v, pLevel->addrCont);
    }
    if( (pLoop->wsFlags & WHERE_IN_ABLE)!=0 && pLevel->u.in.nIn>0 ){
      struct InLoop *pIn;
      int j;
      sqlite3VdbeResolveLabel(v, pLevel->addrNxt);
      for(j=pLevel->u.in.nIn, pIn=&pLevel->u.in.aInLoop[j-1]; j>0; j--, pIn--){
        assert( sqlite3VdbeGetOp(v, pIn->addrInTop+1)->opcode==OP_IsNull
                 || pParse->db->mallocFailed );
        sqlite3VdbeJumpHere(v, pIn->addrInTop+1);
        if( pIn->eEndLoopOp!=OP_Noop ){
          if( pIn->nPrefix ){
            int bEarlyOut =
                (pLoop->wsFlags & WHERE_VIRTUALTABLE)==0
                 && (pLoop->wsFlags & WHERE_IN_EARLYOUT)!=0;
            if( pLevel->iLeftJoin ){
              /* For LEFT JOIN queries, cursor pIn->iCur may not have been
              ** opened yet. This occurs for WHERE clauses such as
              ** "a = ? AND b IN (...)", where the index is on (a, b). If
              ** the RHS of the (a=?) is NULL, then the "b IN (...)" may
              ** never have been coded, but the body of the loop run to
              ** return the null-row. So, if the cursor is not open yet,
              ** jump over the OP_Next or OP_Prev instruction about to
              ** be coded.  */
              sqlite3VdbeAddOp2(v, OP_IfNotOpen, pIn->iCur,
                  sqlite3VdbeCurrentAddr(v) + 2 + bEarlyOut);
              VdbeCoverage(v);
            }
            if( bEarlyOut ){
              sqlite3VdbeAddOp4Int(v, OP_IfNoHope, pLevel->iIdxCur,
                  sqlite3VdbeCurrentAddr(v)+2,
                  pIn->iBase, pIn->nPrefix);
              VdbeCoverage(v);
              /* Retarget the OP_IsNull against the left operand of IN so
              ** it jumps past the OP_IfNoHope.  This is because the
              ** OP_IsNull also bypasses the OP_Affinity opcode that is
              ** required by OP_IfNoHope. */
              sqlite3VdbeJumpHere(v, pIn->addrInTop+1);
            }
          }
          sqlite3VdbeAddOp2(v, pIn->eEndLoopOp, pIn->iCur, pIn->addrInTop);
          VdbeCoverage(v);
          VdbeCoverageIf(v, pIn->eEndLoopOp==OP_Prev);
          VdbeCoverageIf(v, pIn->eEndLoopOp==OP_Next);
        }
        sqlite3VdbeJumpHere(v, pIn->addrInTop-1);
      }
    }
    sqlite3VdbeResolveLabel(v, pLevel->addrBrk);
    if( pLevel->pRJ ){
      sqlite3VdbeAddOp3(v, OP_Return, pLevel->pRJ->regReturn, 0, 1);
      VdbeCoverage(v);
    }
    if( pLevel->addrSkip ){
      sqlite3VdbeGoto(v, pLevel->addrSkip);
      VdbeComment((v, "next skip-scan on %s", pLoop->u.btree.pIndex->zName));
      sqlite3VdbeJumpHere(v, pLevel->addrSkip);
      sqlite3VdbeJumpHere(v, pLevel->addrSkip-2);
    }
#ifndef SQLITE_LIKE_DOESNT_MATCH_BLOBS
    if( pLevel->addrLikeRep ){
      sqlite3VdbeAddOp2(v, OP_DecrJumpZero, (int)(pLevel->iLikeRepCntr>>1),
                        pLevel->addrLikeRep);
      VdbeCoverage(v);
    }
#endif
    if( pLevel->iLeftJoin ){
      int ws = pLoop->wsFlags;
      addr = sqlite3VdbeAddOp1(v, OP_IfPos, pLevel->iLeftJoin); VdbeCoverage(v);
      assert( (ws & WHERE_IDX_ONLY)==0 || (ws & WHERE_INDEXED)!=0 );
      if( (ws & WHERE_IDX_ONLY)==0 ){
        SrcItem *pSrc = &pTabList->a[pLevel->iFrom];
        assert( pLevel->iTabCur==pSrc->iCursor );
        if( pSrc->fg.viaCoroutine ){
          int m, n;
          assert( pSrc->fg.isSubquery );
          n = pSrc->u4.pSubq->regResult;
          assert( pSrc->pSTab!=0 );
          m = pSrc->pSTab->nCol;
          sqlite3VdbeAddOp3(v, OP_Null, 0, n, n+m-1);
        }
        sqlite3VdbeAddOp1(v, OP_NullRow, pLevel->iTabCur);
      }
      if( (ws & WHERE_INDEXED)
       || ((ws & WHERE_MULTI_OR) && pLevel->u.pCoveringIdx)
      ){
        if( ws & WHERE_MULTI_OR ){
          Index *pIx = pLevel->u.pCoveringIdx;
          int iDb = sqlite3SchemaToIndex(db, pIx->pSchema);
          sqlite3VdbeAddOp3(v, OP_ReopenIdx, pLevel->iIdxCur, pIx->tnum, iDb);
          sqlite3VdbeSetP4KeyInfo(pParse, pIx);
        }
        sqlite3VdbeAddOp1(v, OP_NullRow, pLevel->iIdxCur);
      }
      if( pLevel->op==OP_Return ){
        sqlite3VdbeAddOp2(v, OP_Gosub, pLevel->p1, pLevel->addrFirst);
      }else{
        sqlite3VdbeGoto(v, pLevel->addrFirst);
      }
      sqlite3VdbeJumpHere(v, addr);
    }
    VdbeModuleComment((v, "End WHERE-loop%d: %s", i,
                     pWInfo->pTabList->a[pLevel->iFrom].pSTab->zName));
  }

  assert( pWInfo->nLevel<=pTabList->nSrc );
  for(i=0, pLevel=pWInfo->a; i<pWInfo->nLevel; i++, pLevel++){
    int k, last;
    VdbeOp *pOp, *pLastOp;
    Index *pIdx = 0;
    SrcItem *pTabItem = &pTabList->a[pLevel->iFrom];
    Table *pTab = pTabItem->pSTab;
    assert( pTab!=0 );
    pLoop = pLevel->pWLoop;

    /* Do RIGHT JOIN processing.  Generate code that will output the
    ** unmatched rows of the right operand of the RIGHT JOIN with
    ** all of the columns of the left operand set to NULL.
    */
    if( pLevel->pRJ ){
      sqlite3WhereRightJoinLoop(pWInfo, i, pLevel);
      continue;
    }

    /* For a co-routine, change all OP_Column references to the table of
    ** the co-routine into OP_Copy of result contained in a register.
    ** OP_Rowid becomes OP_Null.
    */
    if( pTabItem->fg.viaCoroutine ){
      testcase( pParse->db->mallocFailed );
      assert( pTabItem->fg.isSubquery );
      assert( pTabItem->u4.pSubq->regResult>=0 );
      translateColumnToCopy(pParse, pLevel->addrBody, pLevel->iTabCur,
                            pTabItem->u4.pSubq->regResult, 0);
      continue;
    }

    /* If this scan uses an index, make VDBE code substitutions to read data
    ** from the index instead of from the table where possible.  In some cases
    ** this optimization prevents the table from ever being read, which can
    ** yield a significant performance boost.
    **
    ** Calls to the code generator in between sqlite3WhereBegin and
    ** sqlite3WhereEnd will have created code that references the table
    ** directly.  This loop scans all that code looking for opcodes
    ** that reference the table and converts them into opcodes that
    ** reference the index.
    */
    if( pLoop->wsFlags & (WHERE_INDEXED|WHERE_IDX_ONLY) ){
      pIdx = pLoop->u.btree.pIndex;
    }else if( pLoop->wsFlags & WHERE_MULTI_OR ){
      pIdx = pLevel->u.pCoveringIdx;
    }
    if( pIdx
     && !db->mallocFailed
    ){
      if( pWInfo->eOnePass==ONEPASS_OFF || !HasRowid(pIdx->pTable) ){
        last = iEnd;
      }else{
        last = pWInfo->iEndWhere;
      }
      if( pIdx->bHasExpr ){
        IndexedExpr *p = pParse->pIdxEpr;
        while( p ){
          if( p->iIdxCur==pLevel->iIdxCur ){
#ifdef WHERETRACE_ENABLED
            if( sqlite3WhereTrace & 0x200 ){
              sqlite3DebugPrintf("Disable pParse->pIdxEpr term {%d,%d}\n",
                                  p->iIdxCur, p->iIdxCol);
              if( sqlite3WhereTrace & 0x5000 ) sqlite3ShowExpr(p->pExpr);
            }
#endif
            p->iDataCur = -1;
            p->iIdxCur = -1;
          }
          p = p->pIENext;
        }
      }
      k = pLevel->addrBody + 1;
#ifdef SQLITE_DEBUG
      if( db->flags & SQLITE_VdbeAddopTrace ){
        printf("TRANSLATE cursor %d->%d in opcode range %d..%d\n",
                pLevel->iTabCur, pLevel->iIdxCur, k, last-1);
      }
      /* Proof that the "+1" on the k value above is safe */
      pOp = sqlite3VdbeGetOp(v, k - 1);
      assert( pOp->opcode!=OP_Column || pOp->p1!=pLevel->iTabCur );
      assert( pOp->opcode!=OP_Rowid  || pOp->p1!=pLevel->iTabCur );
      assert( pOp->opcode!=OP_IfNullRow || pOp->p1!=pLevel->iTabCur );
#endif
      pOp = sqlite3VdbeGetOp(v, k);
      pLastOp = pOp + (last - k);
      assert( pOp<=pLastOp );
      do{
        if( pOp->p1!=pLevel->iTabCur ){
          /* no-op */
        }else if( pOp->opcode==OP_Column
#ifdef SQLITE_ENABLE_OFFSET_SQL_FUNC
         || pOp->opcode==OP_Offset
#endif
        ){
          int x = pOp->p2;
          assert( pIdx->pTable==pTab );
#ifdef SQLITE_ENABLE_OFFSET_SQL_FUNC
          if( pOp->opcode==OP_Offset ){
            /* Do not need to translate the column number */
          }else
#endif
          if( !HasRowid(pTab) ){
            Index *pPk = sqlite3PrimaryKeyIndex(pTab);
            x = pPk->aiColumn[x];
            assert( x>=0 );
          }else{
            testcase( x!=sqlite3StorageColumnToTable(pTab,x) );
            x = sqlite3StorageColumnToTable(pTab,x);
          }
          x = sqlite3TableColumnToIndex(pIdx, x);
          if( x>=0 ){
            pOp->p2 = x;
            pOp->p1 = pLevel->iIdxCur;
            OpcodeRewriteTrace(db, k, pOp);
          }else if( pLoop->wsFlags & (WHERE_IDX_ONLY|WHERE_EXPRIDX) ){
            if( pLoop->wsFlags & WHERE_IDX_ONLY ){
              /* An error. pLoop is supposed to be a covering index loop,
              ** and yet the VM code refers to a column of the table that
              ** is not part of the index.  */
              sqlite3ErrorMsg(pParse, "internal query planner error");
              pParse->rc = SQLITE_INTERNAL;
            }else{
              /* The WHERE_EXPRIDX flag is set by the planner when it is likely
              ** that pLoop is a covering index loop, but it is not possible
              ** to be 100% sure. In this case, any OP_Explain opcode
              ** corresponding to this loop describes the index as a "COVERING
              ** INDEX". But, pOp proves that pLoop is not actually a covering
              ** index loop. So clear the WHERE_EXPRIDX flag and rewrite the
              ** text that accompanies the OP_Explain opcode, if any.  */
              pLoop->wsFlags &= ~WHERE_EXPRIDX;
              sqlite3WhereAddExplainText(pParse,
                  pLevel->addrBody-1,
                  pTabList,
                  pLevel,
                  pWInfo->wctrlFlags
              );
            }
          }
        }else if( pOp->opcode==OP_Rowid ){
          pOp->p1 = pLevel->iIdxCur;
          pOp->opcode = OP_IdxRowid;
          OpcodeRewriteTrace(db, k, pOp);
        }else if( pOp->opcode==OP_IfNullRow ){
          pOp->p1 = pLevel->iIdxCur;
          OpcodeRewriteTrace(db, k, pOp);
        }
#ifdef SQLITE_DEBUG
        k++;
#endif
      }while( (++pOp)<pLastOp );
#ifdef SQLITE_DEBUG
      if( db->flags & SQLITE_VdbeAddopTrace ) printf("TRANSLATE complete\n");
#endif
    }
  }

  /* The "break" point is here, just past the end of the outer loop.
  ** Set it.
  */
  sqlite3VdbeResolveLabel(v, pWInfo->iBreak);

  /* Final cleanup
  */
  pParse->nQueryLoop = pWInfo->savedNQueryLoop;
  whereInfoFree(db, pWInfo);
  pParse->withinRJSubrtn -= nRJ;
  return;
}